

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmyblas2.c
# Opt level: O2

void dusolve(int ldm,int ncol,double *M,double *rhs)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  long lVar7;
  
  lVar3 = (long)ncol;
  iVar4 = 0;
  iVar5 = 0;
  if (0 < ncol) {
    iVar5 = ncol;
  }
  pdVar6 = M + (lVar3 + -1) * (long)ldm;
  for (; iVar4 != iVar5; iVar4 = iVar4 + 1) {
    lVar3 = lVar3 + -1;
    dVar1 = rhs[lVar3];
    dVar2 = M[lVar3 + (int)lVar3 * ldm];
    rhs[lVar3] = dVar1 / dVar2;
    for (lVar7 = 0; lVar7 < lVar3; lVar7 = lVar7 + 1) {
      rhs[lVar7] = pdVar6[lVar7] * -(dVar1 / dVar2) + rhs[lVar7];
    }
    pdVar6 = pdVar6 + -(long)ldm;
  }
  return;
}

Assistant:

void dusolve (int ldm, int ncol, double *M, double *rhs)
{
    double xj;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	xj = rhs[jcol] / M[jcol + jcol*ldm]; 		/* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++)
	    rhs[irow] -= xj * M[irow + jcol*ldm];	/* M(irow, jcol) */

	jcol--;

    }
}